

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Expression * __thiscall hdc::Parser::parse_relational_expression(Parser *this)

{
  bool bVar1;
  reference pTVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Expression *local_48;
  Expression *expression;
  Token oper;
  Parser *this_local;
  
  oper._40_8_ = this;
  Token::Token((Token *)&expression);
  local_48 = parse_arith_expression(this);
  while( true ) {
    while( true ) {
      while( true ) {
        while (bVar1 = match(this,TK_LT), bVar1) {
          pTVar2 = __gnu_cxx::
                   __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                   ::operator*(&this->matched);
          Token::operator=((Token *)&expression,pTVar2);
          pEVar3 = (Expression *)operator_new(0x68);
          pEVar4 = parse_arith_expression(this);
          LessThanExpression::LessThanExpression
                    ((LessThanExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
          local_48 = pEVar3;
        }
        bVar1 = match(this,TK_GT);
        if (!bVar1) break;
        pTVar2 = __gnu_cxx::
                 __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                 ::operator*(&this->matched);
        Token::operator=((Token *)&expression,pTVar2);
        pEVar3 = (Expression *)operator_new(0x68);
        pEVar4 = parse_arith_expression(this);
        GreaterThanExpression::GreaterThanExpression
                  ((GreaterThanExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
        local_48 = pEVar3;
      }
      bVar1 = match(this,TK_LE);
      if (!bVar1) break;
      pTVar2 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      Token::operator=((Token *)&expression,pTVar2);
      pEVar3 = (Expression *)operator_new(0x68);
      pEVar4 = parse_arith_expression(this);
      LessThanOrEqualExpression::LessThanOrEqualExpression
                ((LessThanOrEqualExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
      local_48 = pEVar3;
    }
    bVar1 = match(this,TK_GE);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
             ::operator*(&this->matched);
    Token::operator=((Token *)&expression,pTVar2);
    pEVar3 = (Expression *)operator_new(0x68);
    pEVar4 = parse_arith_expression(this);
    GreaterThanOrEqualExpression::GreaterThanOrEqualExpression
              ((GreaterThanOrEqualExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
    local_48 = pEVar3;
  }
  Token::~Token((Token *)&expression);
  return local_48;
}

Assistant:

Expression* Parser::parse_relational_expression() {
    Token oper;
    Expression* expression = parse_arith_expression();

    while (true) {
        if (match(TK_LT)) {
            oper = *matched;
            expression = new LessThanExpression(oper, expression, parse_arith_expression());
        } else if (match(TK_GT)) {
            oper = *matched;
            expression = new GreaterThanExpression(oper, expression, parse_arith_expression());
        } else if (match(TK_LE)) {
            oper = *matched;
            expression = new LessThanOrEqualExpression(oper, expression, parse_arith_expression());
        } else if (match(TK_GE)) {
            oper = *matched;
            expression = new GreaterThanOrEqualExpression(oper, expression, parse_arith_expression());
        } else {
            break;
        }
    }

    return expression;
}